

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FiguresTests.cpp
# Opt level: O3

void __thiscall agge::tests::RectangleTests::RectangleProducesIterator(RectangleTests *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  FailedAssertion *pFVar3;
  int iVar4;
  real_t y;
  real_t x;
  rectangle r;
  real_t rStack_b8;
  real_t local_b4;
  string local_b0;
  string local_90;
  LocationInfo local_70;
  rectangle local_44;
  
  rectangle::rectangle(&local_44,10.0,20.0,30.0,40.0);
  iVar4 = rectangle::vertex(&local_44,&local_b4,&rStack_b8);
  paVar1 = &local_b0.field_2;
  local_b0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_b0,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/FiguresTests.cpp"
             ,"");
  ut::LocationInfo::LocationInfo(&local_70,&local_b0,0x5e);
  if (iVar4 != 1) {
    pFVar3 = (FailedAssertion *)__cxa_allocate_exception(0x38);
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"Values are not equal!","");
    ut::FailedAssertion::FailedAssertion(pFVar3,&local_90,&local_70);
    __cxa_throw(pFVar3,&ut::FailedAssertion::typeinfo,ut::FailedAssertion::~FailedAssertion);
  }
  paVar2 = &local_70.filename.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70.filename._M_dataplus._M_p != paVar2) {
    operator_delete(local_70.filename._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != paVar1) {
    operator_delete(local_b0._M_dataplus._M_p);
  }
  iVar4 = rectangle::vertex(&local_44,&local_b4,&rStack_b8);
  local_b0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_b0,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/FiguresTests.cpp"
             ,"");
  ut::LocationInfo::LocationInfo(&local_70,&local_b0,0x5f);
  if (iVar4 != 2) {
    pFVar3 = (FailedAssertion *)__cxa_allocate_exception(0x38);
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"Values are not equal!","");
    ut::FailedAssertion::FailedAssertion(pFVar3,&local_90,&local_70);
    __cxa_throw(pFVar3,&ut::FailedAssertion::typeinfo,ut::FailedAssertion::~FailedAssertion);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70.filename._M_dataplus._M_p != paVar2) {
    operator_delete(local_70.filename._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != paVar1) {
    operator_delete(local_b0._M_dataplus._M_p);
  }
  iVar4 = rectangle::vertex(&local_44,&local_b4,&rStack_b8);
  local_b0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_b0,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/FiguresTests.cpp"
             ,"");
  ut::LocationInfo::LocationInfo(&local_70,&local_b0,0x60);
  if (iVar4 != 2) {
    pFVar3 = (FailedAssertion *)__cxa_allocate_exception(0x38);
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"Values are not equal!","");
    ut::FailedAssertion::FailedAssertion(pFVar3,&local_90,&local_70);
    __cxa_throw(pFVar3,&ut::FailedAssertion::typeinfo,ut::FailedAssertion::~FailedAssertion);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70.filename._M_dataplus._M_p != paVar2) {
    operator_delete(local_70.filename._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != paVar1) {
    operator_delete(local_b0._M_dataplus._M_p);
  }
  iVar4 = rectangle::vertex(&local_44,&local_b4,&rStack_b8);
  local_b0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_b0,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/FiguresTests.cpp"
             ,"");
  ut::LocationInfo::LocationInfo(&local_70,&local_b0,0x61);
  if (iVar4 == 2) {
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70.filename._M_dataplus._M_p != paVar2) {
      operator_delete(local_70.filename._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != paVar1) {
      operator_delete(local_b0._M_dataplus._M_p);
    }
    iVar4 = rectangle::vertex(&local_44,&local_b4,&rStack_b8);
    local_b0._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_b0,
               "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/FiguresTests.cpp"
               ,"");
    ut::LocationInfo::LocationInfo(&local_70,&local_b0,0x62);
    if (iVar4 != 0x30) {
      pFVar3 = (FailedAssertion *)__cxa_allocate_exception(0x38);
      local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_90,"Values are not equal!","");
      ut::FailedAssertion::FailedAssertion(pFVar3,&local_90,&local_70);
      __cxa_throw(pFVar3,&ut::FailedAssertion::typeinfo,ut::FailedAssertion::~FailedAssertion);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70.filename._M_dataplus._M_p != paVar2) {
      operator_delete(local_70.filename._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != paVar1) {
      operator_delete(local_b0._M_dataplus._M_p);
    }
    iVar4 = rectangle::vertex(&local_44,&local_b4,&rStack_b8);
    local_b0._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_b0,
               "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/FiguresTests.cpp"
               ,"");
    ut::LocationInfo::LocationInfo(&local_70,&local_b0,99);
    if (iVar4 == 0) {
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70.filename._M_dataplus._M_p != paVar2) {
        operator_delete(local_70.filename._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != paVar1) {
        operator_delete(local_b0._M_dataplus._M_p);
      }
      iVar4 = rectangle::vertex(&local_44,&local_b4,&rStack_b8);
      local_b0._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_b0,
                 "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/FiguresTests.cpp"
                 ,"");
      ut::LocationInfo::LocationInfo(&local_70,&local_b0,100);
      if (iVar4 == 0) {
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70.filename._M_dataplus._M_p != paVar2) {
          operator_delete(local_70.filename._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b0._M_dataplus._M_p != paVar1) {
          operator_delete(local_b0._M_dataplus._M_p);
        }
        return;
      }
      pFVar3 = (FailedAssertion *)__cxa_allocate_exception(0x38);
      local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_90,"Values are not equal!","");
      ut::FailedAssertion::FailedAssertion(pFVar3,&local_90,&local_70);
      __cxa_throw(pFVar3,&ut::FailedAssertion::typeinfo,ut::FailedAssertion::~FailedAssertion);
    }
    pFVar3 = (FailedAssertion *)__cxa_allocate_exception(0x38);
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"Values are not equal!","");
    ut::FailedAssertion::FailedAssertion(pFVar3,&local_90,&local_70);
    __cxa_throw(pFVar3,&ut::FailedAssertion::typeinfo,ut::FailedAssertion::~FailedAssertion);
  }
  pFVar3 = (FailedAssertion *)__cxa_allocate_exception(0x38);
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"Values are not equal!","");
  ut::FailedAssertion::FailedAssertion(pFVar3,&local_90,&local_70);
  __cxa_throw(pFVar3,&ut::FailedAssertion::typeinfo,ut::FailedAssertion::~FailedAssertion);
}

Assistant:

test( RectangleProducesIterator )
			{
				// INIT
				real_t x, y;

				// INIT / ACT
				rectangle r(10.0f, 20.0f, 30.0f, 40.0f);

				// ACT / ASSERT
				assert_equal(path_command_move_to, r.vertex(&x, &y));
				assert_equal(path_command_line_to, r.vertex(&x, &y));
				assert_equal(path_command_line_to, r.vertex(&x, &y));
				assert_equal(path_command_line_to, r.vertex(&x, &y));
				assert_equal(path_command_end_poly | path_flag_close, r.vertex(&x, &y));
				assert_equal(path_command_stop, r.vertex(&x, &y));
				assert_equal(path_command_stop, r.vertex(&x, &y));
			}